

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

void __thiscall
FxRandom2::FxRandom2(FxRandom2 *this,FRandom *r,FxExpression *m,FScriptPosition *pos,bool nowarn)

{
  PInt *pPVar1;
  FxExpression *pFVar2;
  
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
  FScriptPosition::FScriptPosition(&(this->super_FxExpression).ScriptPosition,pos);
  (this->super_FxExpression).ValueType = (PType *)0x0;
  (this->super_FxExpression).isresolved = false;
  (this->super_FxExpression).NeedResult = true;
  (this->super_FxExpression).ExprType = EFX_Random2;
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxRandom2_00710520;
  this->EmitTail = false;
  this->rng = r;
  if (m == (FxExpression *)0x0) {
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar2->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition(&pFVar2->ScriptPosition,pos);
    pFVar2->ValueType = (PType *)0x0;
    pFVar2->isresolved = false;
    pFVar2->NeedResult = true;
    pFVar2->ExprType = EFX_Constant;
    pFVar2->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
    pPVar1 = TypeSInt32;
    pFVar2[1]._vptr_FxExpression = (_func_int **)TypeSInt32;
    pFVar2->ValueType = (PType *)pPVar1;
    *(undefined4 *)&pFVar2[1].ScriptPosition.FileName.Chars = 0xffffffff;
    pFVar2->isresolved = true;
  }
  else {
    pFVar2 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
    pFVar2->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
    FScriptPosition::FScriptPosition(&pFVar2->ScriptPosition,&m->ScriptPosition);
    pFVar2->ValueType = (PType *)0x0;
    pFVar2->isresolved = false;
    pFVar2->NeedResult = true;
    pFVar2->ExprType = EFX_IntCast;
    pFVar2->_vptr_FxExpression = (_func_int **)&PTR__FxIntCast_0070f5b0;
    pFVar2[1]._vptr_FxExpression = (_func_int **)m;
    pFVar2->ValueType = (PType *)TypeSInt32;
    *(bool *)&pFVar2[1].ScriptPosition.FileName.Chars = nowarn;
    *(undefined1 *)((long)&pFVar2[1].ScriptPosition.FileName.Chars + 1) = 0;
  }
  this->mask = pFVar2;
  (this->super_FxExpression).ValueType = (PType *)TypeSInt32;
  return;
}

Assistant:

FxRandom2::FxRandom2(FRandom *r, FxExpression *m, const FScriptPosition &pos, bool nowarn)
: FxExpression(EFX_Random2, pos)
{
	EmitTail = false;
	rng = r;
	if (m) mask = new FxIntCast(m, nowarn);
	else mask = new FxConstant(-1, pos);
	ValueType = TypeSInt32;
}